

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void __thiscall
ParserCallbacks::handleObject
          (ParserCallbacks *this,QPDFObjectHandle *obj,size_t offset,size_t length)

{
  char cVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  bool bVar5;
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  cVar1 = QPDFObjectHandle::isName();
  if (cVar1 == '\0') {
    bVar5 = false;
  }
  else {
    QPDFObjectHandle::getName_abi_cxx11_();
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    bVar5 = iVar2 == 0;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"test suite: terminating parsing",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDFObjectHandle::ParserCallbacks::terminateParsing();
  }
  __s = (char *)QPDFObjectHandle::getTypeName();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x15b578);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", offset=",9);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", length=",9);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  cVar1 = QPDFObjectHandle::isInlineImage();
  if (cVar1 == '\0') {
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_90,local_88);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_90 == local_80) {
      return;
    }
  }
  else {
    iVar2 = QPDFObjectHandle::getTypeCode();
    if (iVar2 != 0xc) {
      __assert_fail("obj.getTypeCode() == ::ot_inlineimage",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x78,
                    "virtual void ParserCallbacks::handleObject(QPDFObjectHandle, size_t, size_t)");
    }
    QPDFObjectHandle::getInlineImageValue_abi_cxx11_();
    QUtil::hex_encode((string *)&local_90);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_90,local_88);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    local_80[0] = local_60[0];
    local_90 = local_70;
    if (local_70 == local_60) {
      return;
    }
  }
  operator_delete(local_90,local_80[0] + 1);
  return;
}

Assistant:

void
ParserCallbacks::handleObject(QPDFObjectHandle obj, size_t offset, size_t length)
{
    if (obj.isName() && (obj.getName() == "/Abort")) {
        std::cout << "test suite: terminating parsing" << std::endl;
        terminateParsing();
    }
    std::cout << obj.getTypeName() << ", offset=" << offset << ", length=" << length << ": ";
    if (obj.isInlineImage()) {
        // Exercise getTypeCode
        assert(obj.getTypeCode() == ::ot_inlineimage);
        std::cout << QUtil::hex_encode(obj.getInlineImageValue()) << std::endl;
    } else {
        std::cout << obj.unparse() << std::endl;
    }
}